

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_type fs_get_tempdir(char *path,size_type buffer_size)

{
  size_type sVar1;
  string local_48 [32];
  __sv_type local_28;
  size_type local_18;
  size_type buffer_size_local;
  char *path_local;
  
  local_18 = buffer_size;
  buffer_size_local = (size_type)path;
  fs_get_tempdir_abi_cxx11_();
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  sVar1 = fs_str2char(local_28,(char *)buffer_size_local,local_18);
  std::__cxx11::string::~string(local_48);
  return sVar1;
}

Assistant:

std::string::size_type fs_get_tempdir(char* path, const std::string::size_type buffer_size){
  return fs_str2char(fs_get_tempdir(), path, buffer_size);
}